

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::Clone(SQVM *this,SQObjectPtr *self,SQObjectPtr *target)

{
  SQObjectType SVar1;
  bool bVar2;
  int iVar3;
  SQTable *x;
  SQInstance *x_00;
  SQArray *x_01;
  SQChar *pSVar4;
  SQMetaMethod mm;
  SQObjectPtr newobj;
  SQObjectPtr closure;
  SQObjectPtr temp_reg;
  
  temp_reg.super_SQObject._type = OT_NULL;
  temp_reg.super_SQObject._unVal.pTable = (SQTable *)0x0;
  newobj.super_SQObject._type = OT_NULL;
  newobj.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar1 = (self->super_SQObject)._type;
  if (SVar1 == OT_ARRAY) {
    x_01 = SQArray::Clone((self->super_SQObject)._unVal.pArray);
    bVar2 = true;
    SQObjectPtr::operator=(target,x_01);
  }
  else {
    if (SVar1 == OT_INSTANCE) {
      x_00 = SQInstance::Clone((self->super_SQObject)._unVal.pInstance,this->_sharedstate);
      SQObjectPtr::operator=(&newobj,x_00);
    }
    else {
      if (SVar1 != OT_TABLE) {
        pSVar4 = GetTypeName(self);
        bVar2 = false;
        Raise_Error(this,"cloning a %s",pSVar4);
        goto LAB_0012928d;
      }
      x = SQTable::Clone((self->super_SQObject)._unVal.pTable);
      SQObjectPtr::operator=(&newobj,x);
    }
    closure.super_SQObject._type = OT_NULL;
    closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
    if (((newobj.super_SQObject._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0) {
      iVar3 = (*((newobj.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._vptr_SQRefCounted[6])
                        (newobj.super_SQObject._unVal.pTable,this,0xc,&closure);
      if ((char)iVar3 != '\0') {
        Push(this,&newobj);
        Push(this,self);
        bVar2 = CallMetaMethod(this,&closure,mm,2,&temp_reg);
        if (!bVar2) {
          SQObjectPtr::~SQObjectPtr(&closure);
          bVar2 = false;
          goto LAB_0012928d;
        }
      }
    }
    SQObjectPtr::~SQObjectPtr(&closure);
    bVar2 = true;
    SQObjectPtr::operator=(target,&newobj);
  }
LAB_0012928d:
  SQObjectPtr::~SQObjectPtr(&newobj);
  SQObjectPtr::~SQObjectPtr(&temp_reg);
  return bVar2;
}

Assistant:

bool SQVM::Clone(const SQObjectPtr &self,SQObjectPtr &target)
{
    SQObjectPtr temp_reg;
    SQObjectPtr newobj;
    switch(sq_type(self)){
    case OT_TABLE:
        newobj = _table(self)->Clone();
        goto cloned_mt;
    case OT_INSTANCE: {
        newobj = _instance(self)->Clone(_ss(this));
cloned_mt:
        SQObjectPtr closure;
        if(_delegable(newobj)->_delegate && _delegable(newobj)->GetMetaMethod(this,MT_CLONED,closure)) {
            Push(newobj);
            Push(self);
            if(!CallMetaMethod(closure,MT_CLONED,2,temp_reg))
                return false;
        }
        }
        target = newobj;
        return true;
    case OT_ARRAY:
        target = _array(self)->Clone();
        return true;
    default:
        Raise_Error(_SC("cloning a %s"), GetTypeName(self));
        return false;
    }
}